

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfileInstrument.cpp
# Opt level: O0

void __thiscall Js::Profiler::Push(Profiler *this,TimeEntry entry)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar4;
  TreeNode<Js::UnitData,_373> *pTVar5;
  TimeEntry item;
  TrackAllocData local_60;
  TreeNode<Js::UnitData,_373> *local_38;
  TypeNode *node;
  TimeEntry local_28;
  Profiler *this_local;
  TimeEntry entry_local;
  
  entry_local._0_8_ = entry.time;
  this_local._0_2_ = entry.tag;
  local_28.time = (TimeStamp)this;
  if (this->curNode == (TypeNode *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ProfileInstrument.cpp"
                                ,0xa3,"(0 != curNode)","Profiler Stack Corruption");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  node = (TypeNode *)CONCAT62(this_local._2_6_,(Phase)this_local);
  local_28.tag = entry_local.tag;
  local_28._2_6_ = entry_local._2_6_;
  item._2_6_ = 0;
  item.tag = (Phase)this_local;
  item.time = entry_local._0_8_;
  FixedStack<Js::TimeEntry,_20>::Push(&this->timeStack,item);
  bVar2 = TreeNode<Js::UnitData,_373>::ChildExistsAt(this->curNode,(uint)(Phase)this_local);
  if (!bVar2) {
    pAVar4 = &this->alloc->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_60,(type_info *)&TreeNode<Js::UnitData,373>::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ProfileInstrument.cpp"
               ,0xa8);
    pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo(pAVar4,&local_60);
    pTVar5 = (TreeNode<Js::UnitData,_373> *)
             new<Memory::ArenaAllocator>(0xbd0,(ArenaAllocator *)pAVar4,true,0x3f6470);
    TreeNode<Js::UnitData,_373>::TreeNode(pTVar5,this->curNode);
    local_38 = pTVar5;
    TreeNode<Js::UnitData,_373>::SetChildAt(this->curNode,(uint)(Phase)this_local,pTVar5);
  }
  pTVar5 = TreeNode<Js::UnitData,_373>::GetChildAt(this->curNode,(uint)(Phase)this_local);
  this->curNode = pTVar5;
  return;
}

Assistant:

void
    Profiler::Push(TimeEntry entry)
    {
        AssertMsg(NULL != curNode, "Profiler Stack Corruption");

        this->timeStack.Push(entry);
        if(!curNode->ChildExistsAt(entry.tag))
        {
            TypeNode * node = AnewNoThrow(this->alloc, TypeNode, curNode);
            // We crash if we run out of memory here and we don't care
            curNode->SetChildAt(entry.tag, node);
        }
        curNode = curNode->GetChildAt(entry.tag);
    }